

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDInt8x16Operation::OpGreaterThanOrEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  BOOL BVar1;
  _x86_SIMDValue _Var2;
  _x86_SIMDValue _Var3;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar4;
  X86SIMDValue x86Tmp2;
  X86SIMDValue x86Tmp1;
  X86SIMDValue tmpbValue;
  X86SIMDValue tmpaValue;
  X86SIMDValue x86Result;
  SIMDValue *bValue_local;
  SIMDValue *aValue_local;
  byte local_88;
  byte bStack_87;
  byte bStack_86;
  byte bStack_85;
  byte bStack_84;
  byte bStack_83;
  byte bStack_82;
  byte bStack_81;
  byte local_78;
  byte bStack_77;
  byte bStack_76;
  byte bStack_75;
  byte bStack_74;
  byte bStack_73;
  byte bStack_72;
  byte bStack_71;
  
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(aValue);
  _Var3 = _x86_SIMDValue::ToX86SIMDValue(bValue);
  BVar1 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
  bStack_77 = _Var2.field_0._1_1_;
  bStack_76 = _Var2.field_0._2_1_;
  bStack_75 = _Var2.field_0._3_1_;
  bStack_74 = _Var2.field_0._4_1_;
  bStack_73 = _Var2.field_0._5_1_;
  bStack_72 = _Var2.field_0._6_1_;
  bStack_71 = _Var2.field_0._7_1_;
  local_88 = _Var3.field_0._0_1_;
  bStack_87 = _Var3.field_0._1_1_;
  bStack_86 = _Var3.field_0._2_1_;
  bStack_85 = _Var3.field_0._3_1_;
  bStack_84 = _Var3.field_0._4_1_;
  bStack_83 = _Var3.field_0._5_1_;
  bStack_82 = _Var3.field_0._6_1_;
  bStack_81 = _Var3.field_0._7_1_;
  local_78 = _Var2.field_0._0_1_;
  if (BVar1 == 0) {
    tmpaValue.field_0.i64[1] =
         CONCAT17(-((char)bStack_81 < (char)bStack_71),
                  CONCAT16(-((char)bStack_82 < (char)bStack_72),
                           CONCAT15(-((char)bStack_83 < (char)bStack_73),
                                    CONCAT14(-((char)bStack_84 < (char)bStack_74),
                                             CONCAT13(-((char)bStack_85 < (char)bStack_75),
                                                      CONCAT12(-((char)bStack_86 < (char)bStack_76),
                                                               CONCAT11(-((char)bStack_87 <
                                                                         (char)bStack_77),
                                                                        -((char)local_88 <
                                                                         (char)local_78)))))))) |
         CONCAT17(-(bStack_71 == bStack_81),
                  CONCAT16(-(bStack_72 == bStack_82),
                           CONCAT15(-(bStack_73 == bStack_83),
                                    CONCAT14(-(bStack_74 == bStack_84),
                                             CONCAT13(-(bStack_75 == bStack_85),
                                                      CONCAT12(-(bStack_76 == bStack_86),
                                                               CONCAT11(-(bStack_77 == bStack_87),
                                                                        -(local_78 == local_88))))))
                          ));
  }
  else {
    tmpaValue.field_0.i8[9] =
         -(bStack_77 ==
          (byte)(((char)bStack_77 < (char)bStack_87) * bStack_87 |
                ((char)bStack_77 >= (char)bStack_87) * bStack_77));
    tmpaValue.field_0.i8[8] =
         -(local_78 ==
          (byte)(((char)local_78 < (char)local_88) * local_88 |
                ((char)local_78 >= (char)local_88) * local_78));
    tmpaValue.field_0.i8[10] =
         -(bStack_76 ==
          (byte)(((char)bStack_76 < (char)bStack_86) * bStack_86 |
                ((char)bStack_76 >= (char)bStack_86) * bStack_76));
    tmpaValue.field_0.i8[0xb] =
         -(bStack_75 ==
          (byte)(((char)bStack_75 < (char)bStack_85) * bStack_85 |
                ((char)bStack_75 >= (char)bStack_85) * bStack_75));
    tmpaValue.field_0.i8[0xc] =
         -(bStack_74 ==
          (byte)(((char)bStack_74 < (char)bStack_84) * bStack_84 |
                ((char)bStack_74 >= (char)bStack_84) * bStack_74));
    tmpaValue.field_0.i8[0xd] =
         -(bStack_73 ==
          (byte)(((char)bStack_73 < (char)bStack_83) * bStack_83 |
                ((char)bStack_73 >= (char)bStack_83) * bStack_73));
    tmpaValue.field_0.i8[0xe] =
         -(bStack_72 ==
          (byte)(((char)bStack_72 < (char)bStack_82) * bStack_82 |
                ((char)bStack_72 >= (char)bStack_82) * bStack_72));
    tmpaValue.field_0.i8[0xf] =
         -(bStack_71 ==
          (byte)(((char)bStack_71 < (char)bStack_81) * bStack_81 |
                ((char)bStack_71 >= (char)bStack_81) * bStack_71));
  }
  aVar4 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpaValue.field_0 + 8));
  return (SIMDValue)aVar4;
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpGreaterThanOrEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        if (AutoSystemInfo::Data.SSE4_1Available())
        {
            x86Result.m128i_value = _mm_max_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value);  //  max(a,b) == b
            x86Result.m128i_value = _mm_cmpeq_epi8(tmpaValue.m128i_value, x86Result.m128i_value); //
        }
        else
        {
            X86SIMDValue x86Tmp1, x86Tmp2;
            x86Tmp1.m128i_value = _mm_cmpgt_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a > b?
            x86Tmp2.m128i_value = _mm_cmpeq_epi8(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a == b?
            x86Result.m128i_value = _mm_or_si128(x86Tmp1.m128i_value, x86Tmp2.m128i_value);
        }


        return X86SIMDValue::ToSIMDValue(x86Result);
    }